

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O3

void bsp_check_exit(void)

{
  MPI_Comm comm;
  ulong uVar1;
  unsigned_long max_msg_size;
  unsigned_long min_n_hp_msg_size;
  bool bVar2;
  int iVar3;
  int iVar4;
  Spmd *pSVar5;
  Rdma *this;
  Bsmp *this_00;
  char *pcVar6;
  size_t small_exch_size;
  int fini;
  int init;
  int iStack_bc;
  double dStack_b8;
  double dStack_b0;
  unsigned_long uStack_a8;
  int iStack_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  unsigned_long uStack_78;
  double dStack_70;
  double dStack_68;
  int iStack_5c;
  int local_20;
  int local_1c;
  
  if (s_expect_abort_msg == (char *)0x0) {
    local_1c = 0;
    local_20 = 0;
    MPI_Initialized(&local_1c);
    MPI_Finalized(&local_20);
    if (((local_1c != 0) && (local_20 == 0)) && (s_aborting == '\0')) {
      if (s_spmd != (Spmd *)0x0) {
        bsp_check_exit();
      }
      MPI_Abort(&ompi_mpi_comm_world,0);
    }
    return;
  }
  pcVar6 = s_expect_abort_msg;
  bsp_check_exit();
  iStack_5c = 0;
  MPI_Initialized(&iStack_5c);
  if (iStack_5c == 0) {
    MPI_Init(0,0);
    atexit(bsp_check_exit);
  }
  iStack_9c = 0;
  MPI_Comm_rank(&ompi_mpi_comm_world);
  if (s_spmd != (Spmd *)0x0) {
    bsp_abort("bsp_begin: May be called only once\n");
  }
  iVar3 = (int)pcVar6;
  if ((iVar3 < 1) && (iStack_9c == 0)) {
    bsp_abort("bsp_begin: The requested number of processes must be strictly greater than 0. Instead, it was %d\n"
              ,(ulong)pcVar6 & 0xffffffff);
  }
  pSVar5 = (Spmd *)operator_new(0x28);
  bsplib::Spmd::Spmd(pSVar5,iVar3);
  s_spmd = pSVar5;
  if (pSVar5->m_active == false) {
    iVar4 = bsplib::Spmd::end_sync(pSVar5);
    if (iVar4 != 0) {
      bsp_abort("bsp_end: Unexpected internal error\n");
    }
    bsplib::Spmd::close(s_spmd,iVar3);
    pSVar5 = s_spmd;
    if (s_spmd != (Spmd *)0x0) {
      bsplib::Spmd::~Spmd(s_spmd);
    }
    operator_delete(pSVar5,0x28);
    s_spmd = (Spmd *)0x0;
    exit(0);
  }
  uStack_a8 = 0x7fffffff;
  bVar2 = bsplib::read_env<unsigned_long>("BSPONMPI_MAX_MSG_SIZE",&uStack_a8);
  if ((bVar2) || (uStack_a8 == 0)) {
    bsp_begin_cold_1();
  }
  uVar1 = 0x7fffffff / (long)s_spmd->m_nprocs;
  iVar3 = (int)uVar1;
  iStack_bc = 0x400;
  if (iVar3 < 0x400) {
    iStack_bc = iVar3;
  }
  bVar2 = bsplib::read_env<int>("BSPONMPI_SMALL_EXCHANGE_SIZE",&iStack_bc);
  if (((bVar2) || (iStack_bc < 0)) || (iVar3 < iStack_bc)) {
    fprintf(_stderr,
            "bsp_begin: WARNING! BSPONMPI_SMALL_EXCHANGE_SIZE was not an integer between 0 and %d \n"
            ,uVar1 & 0xffffffff);
  }
  dStack_b0 = 10000.0;
  dStack_b8 = 1.0;
  bVar2 = bsplib::read_env<double>("BSPONMPI_P2P_LATENCY",&dStack_b0);
  if ((bVar2) || (dStack_b0 < 0.0)) {
    bsp_begin_cold_2();
  }
  bVar2 = bsplib::read_env<double>("BSPONMPI_P2P_MSGGAP",&dStack_b8);
  if ((bVar2) || (dStack_b8 < 0.0)) {
    bsp_begin_cold_3();
  }
  uStack_78 = 0;
  bVar2 = bsplib::read_env<unsigned_long>("BSPONMPI_P2P_N_HP",&uStack_78);
  if (bVar2) {
    bsp_begin_cold_4();
  }
  bStack_98._M_dataplus._M_p = (pointer)&bStack_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&bStack_98,"rma","");
  bVar2 = bsplib::read_env<std::__cxx11::string>("BSPONMPI_A2A_METHOD",&bStack_98);
  if (!bVar2) {
    iVar3 = std::__cxx11::string::compare((char *)&bStack_98);
    if (iVar3 == 0) goto LAB_00105ef3;
    iVar3 = std::__cxx11::string::compare((char *)&bStack_98);
    if (iVar3 == 0) goto LAB_00105ef3;
  }
  std::__cxx11::string::_M_replace((ulong)&bStack_98,0,(char *)bStack_98._M_string_length,0x11041b);
  bsp_begin_cold_5();
LAB_00105ef3:
  this = (Rdma *)operator_new(0x500);
  min_n_hp_msg_size = uStack_78;
  max_msg_size = uStack_a8;
  comm = s_spmd->m_comm;
  small_exch_size = (size_t)iStack_bc;
  dStack_68 = dStack_b0;
  dStack_70 = dStack_b8;
  iVar3 = std::__cxx11::string::compare((char *)&bStack_98);
  bsplib::Rdma::Rdma(this,comm,max_msg_size,small_exch_size,dStack_68,dStack_70,min_n_hp_msg_size,
                     (uint)(iVar3 != 0));
  s_rdma = this;
  this_00 = (Bsmp *)operator_new(0x218);
  bsplib::Bsmp::Bsmp(this_00,s_spmd->m_comm,uStack_a8,(long)iStack_bc);
  s_bsmp = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_98._M_dataplus._M_p != &bStack_98.field_2) {
    operator_delete(bStack_98._M_dataplus._M_p,bStack_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void bsp_check_exit(void) 
{
    if ( s_expect_abort_msg ) {
        std::fprintf(stderr, "An error should have been detected '%s'\n",
                s_expect_abort_msg );
        std::abort();
    }

    int init = 0, fini = 0;
    MPI_Initialized(&init);
    MPI_Finalized(&fini);
    if (init && !fini && !s_aborting ) {
        // calling mpi_finalize() in atexit handler, might
        // deadlock some MPI implementations (Microsoft, IBM)
        if (s_spmd) {
            std::fprintf( stderr, "bsp_end: was not called before end of program\n");
            MPI_Abort( MPI_COMM_WORLD, EXIT_FAILURE );
        }
        MPI_Abort( MPI_COMM_WORLD, EXIT_SUCCESS );
    }
}